

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationIntegerConversion_Test::TestBody
          (TimeUtilTest_DurationIntegerConversion_Test *this)

{
  Duration *duration;
  Duration *duration_00;
  Duration *duration_01;
  Duration *duration_02;
  Duration *duration_03;
  Duration *duration_04;
  Duration *duration_05;
  Duration *duration_06;
  Duration *duration_07;
  Duration *duration_08;
  Duration *duration_09;
  Duration *duration_10;
  char *pcVar1;
  AssertHelper local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Duration local_40;
  int64_t local_18;
  
  TimeUtil::NanosecondsToDuration(&local_40,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration);
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)&local_70,"\"0.000000001s\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToDuration(1))",(char (*) [13])0x1235c1d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x78,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::NanosecondsToDuration(&local_40,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_00);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&local_70,"\"-0.000000001s\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToDuration(-1))",
             (char (*) [14])"-0.000000001s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x7a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MicrosecondsToDuration(&local_40,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_01);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&local_70,"\"0.000001s\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(1))",(char (*) [10])0x1235cb5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x7c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MicrosecondsToDuration(&local_40,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_02);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_70,"\"-0.000001s\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(-1))",(char (*) [11])"-0.000001s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x7e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MillisecondsToDuration(&local_40,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_03);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_70,"\"0.001s\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToDuration(1))",(char (*) [7])0x1235d44,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MillisecondsToDuration(&local_40,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_04);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_70,"\"-0.001s\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToDuration(-1))",(char (*) [8])"-0.001s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x81,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::SecondsToDuration(&local_40,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_05);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_70,"\"1s\"","TimeUtil::ToString(TimeUtil::SecondsToDuration(1))",
             (char (*) [3])0x1235d86,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x82,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::SecondsToDuration(&local_40,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_06);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_70,"\"-1s\"","TimeUtil::ToString(TimeUtil::SecondsToDuration(-1))",
             (char (*) [4])"-1s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x83,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MinutesToDuration(&local_40,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_07);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_70,"\"60s\"","TimeUtil::ToString(TimeUtil::MinutesToDuration(1))",
             (char (*) [4])0x1235dfe,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x84,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::MinutesToDuration(&local_40,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_08);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_70,"\"-60s\"","TimeUtil::ToString(TimeUtil::MinutesToDuration(-1))",
             (char (*) [5])"-60s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x85,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::HoursToDuration(&local_40,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_09);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_70,"\"3600s\"","TimeUtil::ToString(TimeUtil::HoursToDuration(1))",
             (char (*) [6])0x1235e77,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x86,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  TimeUtil::HoursToDuration(&local_40,-1);
  TimeUtil::ToString_abi_cxx11_((string *)local_60,(TimeUtil *)&local_40,duration_10);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_70,"\"-3600s\"","TimeUtil::ToString(TimeUtil::HoursToDuration(-1))",
             (char (*) [7])"-3600s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_40);
  if (local_70.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x87,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_18 = CONCAT44(local_18._4_4_,1);
  TimeUtil::NanosecondsToDuration(&local_40,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToNanoseconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::DurationToNanoseconds(TimeUtil::NanosecondsToDuration(1))",(int *)&local_18,
             (long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x8a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,0xffffffff);
  TimeUtil::NanosecondsToDuration(&local_40,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToNanoseconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::DurationToNanoseconds(TimeUtil::NanosecondsToDuration(-1))",(int *)&local_18
             ,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x8c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,1);
  TimeUtil::MicrosecondsToDuration(&local_40,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToMicroseconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::DurationToMicroseconds(TimeUtil::MicrosecondsToDuration(1))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x8e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,0xffffffff);
  TimeUtil::MicrosecondsToDuration(&local_40,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToMicroseconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::DurationToMicroseconds( TimeUtil::MicrosecondsToDuration(-1))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x90,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,1);
  TimeUtil::MillisecondsToDuration(&local_40,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToMilliseconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::DurationToMilliseconds(TimeUtil::MillisecondsToDuration(1))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x92,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,0xffffffff);
  TimeUtil::MillisecondsToDuration(&local_40,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToMilliseconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::DurationToMilliseconds( TimeUtil::MillisecondsToDuration(-1))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x94,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_70.data_ = (AssertHelperData *)0x11f03c3613000;
  TimeUtil::SecondsToDuration(&local_40,0x4979cb9e00);
  local_18 = TimeUtil::DurationToMilliseconds(&local_40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_60,"315576000000000",
             "TimeUtil::DurationToMilliseconds( TimeUtil::SecondsToDuration(315576000000))",
             (long *)&local_70,&local_18);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x97,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_70.data_ = (AssertHelperData *)0x46126b333a38000;
  TimeUtil::SecondsToDuration(&local_40,0x4979cb9e00);
  local_18 = TimeUtil::DurationToMicroseconds(&local_40);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_60,"315576000000000000",
             "TimeUtil::DurationToMicroseconds( TimeUtil::SecondsToDuration(315576000000))",
             (long *)&local_70,&local_18);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,1);
  TimeUtil::SecondsToDuration(&local_40,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToSeconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1","TimeUtil::DurationToSeconds(TimeUtil::SecondsToDuration(1))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,0xffffffff);
  TimeUtil::SecondsToDuration(&local_40,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToSeconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::DurationToSeconds(TimeUtil::SecondsToDuration(-1))",(int *)&local_18,
             (long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,1);
  TimeUtil::MinutesToDuration(&local_40,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToMinutes(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1","TimeUtil::DurationToMinutes(TimeUtil::MinutesToDuration(1))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,0xffffffff);
  TimeUtil::MinutesToDuration(&local_40,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToMinutes(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::DurationToMinutes(TimeUtil::MinutesToDuration(-1))",(int *)&local_18,
             (long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,1);
  TimeUtil::HoursToDuration(&local_40,1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToHours(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1","TimeUtil::DurationToHours(TimeUtil::HoursToDuration(1))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,0xffffffff);
  TimeUtil::HoursToDuration(&local_40,-1);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToHours(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1","TimeUtil::DurationToHours(TimeUtil::HoursToDuration(-1))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xa0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,1);
  TimeUtil::NanosecondsToDuration(&local_40,1999);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToMicroseconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"1",
             "TimeUtil::DurationToMicroseconds( TimeUtil::NanosecondsToDuration(1999))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xa4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_18 = CONCAT44(local_18._4_4_,0xffffffff);
  TimeUtil::NanosecondsToDuration(&local_40,-1999);
  local_70.data_ = (AssertHelperData *)TimeUtil::DurationToMicroseconds(&local_40);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_60,"-1",
             "TimeUtil::DurationToMicroseconds( TimeUtil::NanosecondsToDuration(-1999))",
             (int *)&local_18,(long *)&local_70);
  Duration::~Duration(&local_40);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xa7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_40.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_40.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  return;
}

Assistant:

TEST(TimeUtilTest, DurationIntegerConversion) {
  EXPECT_EQ("0.000000001s",
            TimeUtil::ToString(TimeUtil::NanosecondsToDuration(1)));
  EXPECT_EQ("-0.000000001s",
            TimeUtil::ToString(TimeUtil::NanosecondsToDuration(-1)));
  EXPECT_EQ("0.000001s",
            TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(1)));
  EXPECT_EQ("-0.000001s",
            TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(-1)));
  EXPECT_EQ("0.001s", TimeUtil::ToString(TimeUtil::MillisecondsToDuration(1)));
  EXPECT_EQ("-0.001s",
            TimeUtil::ToString(TimeUtil::MillisecondsToDuration(-1)));
  EXPECT_EQ("1s", TimeUtil::ToString(TimeUtil::SecondsToDuration(1)));
  EXPECT_EQ("-1s", TimeUtil::ToString(TimeUtil::SecondsToDuration(-1)));
  EXPECT_EQ("60s", TimeUtil::ToString(TimeUtil::MinutesToDuration(1)));
  EXPECT_EQ("-60s", TimeUtil::ToString(TimeUtil::MinutesToDuration(-1)));
  EXPECT_EQ("3600s", TimeUtil::ToString(TimeUtil::HoursToDuration(1)));
  EXPECT_EQ("-3600s", TimeUtil::ToString(TimeUtil::HoursToDuration(-1)));

  EXPECT_EQ(
      1, TimeUtil::DurationToNanoseconds(TimeUtil::NanosecondsToDuration(1)));
  EXPECT_EQ(
      -1, TimeUtil::DurationToNanoseconds(TimeUtil::NanosecondsToDuration(-1)));
  EXPECT_EQ(
      1, TimeUtil::DurationToMicroseconds(TimeUtil::MicrosecondsToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToMicroseconds(
                    TimeUtil::MicrosecondsToDuration(-1)));
  EXPECT_EQ(
      1, TimeUtil::DurationToMilliseconds(TimeUtil::MillisecondsToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToMilliseconds(
                    TimeUtil::MillisecondsToDuration(-1)));
  // Test overflow issue
  EXPECT_EQ(315576000000000, TimeUtil::DurationToMilliseconds(
                                 TimeUtil::SecondsToDuration(315576000000)));
  // Test overflow issue
  EXPECT_EQ(315576000000000000, TimeUtil::DurationToMicroseconds(
                                    TimeUtil::SecondsToDuration(315576000000)));
  EXPECT_EQ(1, TimeUtil::DurationToSeconds(TimeUtil::SecondsToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToSeconds(TimeUtil::SecondsToDuration(-1)));
  EXPECT_EQ(1, TimeUtil::DurationToMinutes(TimeUtil::MinutesToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToMinutes(TimeUtil::MinutesToDuration(-1)));
  EXPECT_EQ(1, TimeUtil::DurationToHours(TimeUtil::HoursToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToHours(TimeUtil::HoursToDuration(-1)));

  // Test truncation behavior.
  EXPECT_EQ(1, TimeUtil::DurationToMicroseconds(
                   TimeUtil::NanosecondsToDuration(1999)));
  // For negative values, Duration will be rounded towards 0.
  EXPECT_EQ(-1, TimeUtil::DurationToMicroseconds(
                    TimeUtil::NanosecondsToDuration(-1999)));
}